

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::insert
          (SmallVector<unsigned_int,_8UL> *this,uint *itr,uint *insert_begin,uint *insert_end)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  AlignedBuffer<unsigned_int,_8UL> *pAVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  size_t __n;
  long lVar11;
  AlignedBuffer<unsigned_int,_8UL> *pAVar12;
  size_t sVar13;
  uint *__ptr;
  ulong uVar14;
  
  uVar14 = (long)insert_end - (long)insert_begin >> 2;
  __ptr = (this->super_VectorView<unsigned_int>).ptr;
  sVar13 = (this->super_VectorView<unsigned_int>).buffer_size;
  puVar10 = __ptr + sVar13;
  uVar5 = sVar13 + uVar14;
  if (puVar10 == itr) {
    reserve(this,uVar5);
    sVar13 = (this->super_VectorView<unsigned_int>).buffer_size;
    if (insert_end != insert_begin) {
      puVar10 = (this->super_VectorView<unsigned_int>).ptr;
      lVar11 = 0;
      do {
        puVar10[sVar13 + lVar11] = insert_begin[lVar11];
        lVar11 = lVar11 + 1;
      } while (uVar14 + (uVar14 == 0) != lVar11);
    }
  }
  else if (this->buffer_capacity < uVar5) {
    uVar4 = 8;
    if (8 < uVar5) {
      uVar4 = uVar5;
    }
    do {
      uVar5 = uVar4;
      uVar4 = uVar5 * 2;
    } while (uVar5 < uVar14);
    if (uVar5 < 9) {
      pAVar6 = &this->stack_storage;
    }
    else {
      pAVar6 = (AlignedBuffer<unsigned_int,_8UL> *)malloc(uVar5 * 4);
      if (pAVar6 == (AlignedBuffer<unsigned_int,_8UL> *)0x0) {
        ::std::terminate();
      }
    }
    puVar8 = __ptr;
    pAVar12 = pAVar6;
    if (__ptr != itr && pAVar6 != (AlignedBuffer<unsigned_int,_8UL> *)__ptr) {
      do {
        *(uint *)pAVar12->aligned_char = *puVar8;
        puVar8 = puVar8 + 1;
        pAVar12 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar12->aligned_char + 4);
      } while (puVar8 != itr);
    }
    puVar9 = insert_begin;
    if (insert_begin != insert_end) {
      do {
        *(uint *)pAVar12->aligned_char = *puVar9;
        puVar9 = puVar9 + 1;
        pAVar12 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar12->aligned_char + 4);
      } while (puVar9 != insert_end);
    }
    if (puVar8 != puVar10 &&
        (pAVar6 != (AlignedBuffer<unsigned_int,_8UL> *)__ptr || insert_begin != insert_end)) {
      do {
        *(uint *)pAVar12->aligned_char = *puVar8;
        puVar8 = puVar8 + 1;
        pAVar12 = (AlignedBuffer<unsigned_int,_8UL> *)(pAVar12->aligned_char + 4);
      } while (puVar8 != puVar10);
    }
    if ((AlignedBuffer<unsigned_int,_8UL> *)__ptr != &this->stack_storage) {
      free(__ptr);
      sVar13 = (this->super_VectorView<unsigned_int>).buffer_size;
    }
    (this->super_VectorView<unsigned_int>).ptr = (uint *)pAVar6;
    this->buffer_capacity = uVar5;
  }
  else {
    lVar11 = ((long)insert_end - (long)insert_begin) + (long)puVar10;
    if (insert_end != insert_begin) {
      lVar7 = 0;
      do {
        *(undefined4 *)(lVar11 + -4 + lVar7) = *(undefined4 *)(lVar7 + -4 + (long)puVar10);
        lVar1 = lVar7 + -4;
        if ((long)insert_begin + (4 - (long)insert_end) == lVar7) break;
        lVar3 = lVar7 + -4;
        lVar7 = lVar1;
      } while ((uint *)((long)puVar10 + lVar3) != itr);
      puVar10 = (uint *)((long)puVar10 + lVar1);
      lVar11 = lVar11 + lVar1;
    }
    __n = (long)puVar10 - (long)itr;
    if (__n != 0) {
      memmove((void *)(lVar11 - __n),itr,__n);
      __ptr = (this->super_VectorView<unsigned_int>).ptr;
      sVar13 = (this->super_VectorView<unsigned_int>).buffer_size;
    }
    if (__ptr + sVar13 != itr && insert_end != insert_begin) {
      do {
        uVar2 = *insert_begin;
        insert_begin = insert_begin + 1;
        *itr = uVar2;
        itr = itr + 1;
        if (itr == __ptr + sVar13) break;
      } while (insert_begin != insert_end);
    }
    for (; insert_begin != insert_end; insert_begin = insert_begin + 1) {
      *itr = *insert_begin;
      itr = itr + 1;
    }
  }
  (this->super_VectorView<unsigned_int>).buffer_size = sVar13 + uVar14;
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}